

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

void duckdb::TimeToStringCast::Format
               (char *data,idx_t length,int32_t hour,int32_t minute,int32_t second,
               int32_t microsecond,char *micro_buffer)

{
  FormatTwoDigits(data,hour);
  data[2] = ':';
  FormatTwoDigits(data + 3,minute);
  data[5] = ':';
  FormatTwoDigits(data + 6,second);
  if (8 < length) {
    data[8] = '.';
    switchD_00916250::default(data + 9,micro_buffer,length - 9);
    return;
  }
  return;
}

Assistant:

static void Format(char *data, idx_t length, int32_t hour, int32_t minute, int32_t second, int32_t microsecond,
	                   char micro_buffer[]) {
		// first write hour, month and day
		FormatTwoDigits(data, hour);
		data[2] = ':';
		FormatTwoDigits(data + 3, minute);
		data[5] = ':';
		FormatTwoDigits(data + 6, second);
		if (length > 8) {
			// write the micro seconds at the end
			data[8] = '.';
			memcpy(data + 9, micro_buffer, length - 9);
		}
	}